

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O1

void __thiscall higan::MultiplexEpoll::UpdateChannel(MultiplexEpoll *this,Channel *channel)

{
  bool bVar1;
  bool bVar2;
  ChannelStatus CVar3;
  LogLevel LVar4;
  int event;
  Logger local_238;
  
  if (channel != (Channel *)0x0) {
    bVar1 = Channel::GetRegisterWritable(channel);
    bVar2 = Channel::GetRegisterReadable(channel);
    event = (uint)bVar2 + (uint)bVar1 * 4;
    CVar3 = Channel::GetChannelStatus(channel);
    if (CVar3 == CHANNEL_ADDED) {
      if (event == 0) {
        UpdateChannelEvent(this,channel,0,3);
        return;
      }
      UpdateChannelEvent(this,channel,0,2);
      CVar3 = CHANNEL_NOT_ADDED;
LAB_0010addd:
      Channel::SetChannelStatus(channel,CVar3);
      return;
    }
    if (CVar3 == CHANNEL_NOT_ADDED) {
      if (event != 0) {
        UpdateChannelEvent(this,channel,event,1);
        CVar3 = CHANNEL_ADDED;
        goto LAB_0010addd;
      }
      LVar4 = Logger::GetLogLevel();
      if ((int)LVar4 < 3) {
        Logger::Logger(&local_238,WARN,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/multiplexing/MultiplexEpoll.cpp"
                       ,0x83,"UpdateChannel");
        Logger::operator<<(&local_238,"CHANNEL_NOT_ADDED but no event");
        Logger::~Logger(&local_238);
      }
    }
  }
  return;
}

Assistant:

void MultiplexEpoll::UpdateChannel(Channel* channel)
{
	if (!channel)
	{
		return;
	}

	int event = EPOLL_DEFAULT_EVENT;
	event |= channel->GetRegisterWritable() ? EPOLLOUT : 0;
	event |= channel->GetRegisterReadable() ? EPOLLIN : 0;

	/**
	 * 当Channel未被注册时 如果没有设定事件则错误 设定了事件则添加Channel
	 * 当Channel注册后, 如果事件为空则清除Channel, 否则修改注册事件
	 */

	switch (channel->GetChannelStatus())
	{
		case Channel::CHANNEL_NOT_ADDED:
		{
			if (event == EPOLL_DEFAULT_EVENT)
			{
				LOG_WARN << "CHANNEL_NOT_ADDED but no event";
			}
			else
			{
				UpdateChannelEvent(channel, event, EPOLL_CTL_ADD);
				channel->SetChannelStatus(Channel::CHANNEL_ADDED);
			}
			break;
		}
		case Channel::CHANNEL_ADDED:
		{
			if (event == EPOLL_DEFAULT_EVENT)
			{
				UpdateChannelEvent(channel, event, EPOLL_CTL_MOD);
			}
			else
			{
				UpdateChannelEvent(channel, 0, EPOLL_CTL_DEL);
				channel->SetChannelStatus(Channel::CHANNEL_NOT_ADDED);
			};
			break;
		}
	}
}